

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O3

__uint128_t * kmer_cannonical128(__uint128_t *__return_storage_ptr__,__uint128_t kmer,uint8_t k)

{
  int in_EDX;
  undefined7 in_register_00000031;
  ulong uVar1;
  __uint128_t *p_Var2;
  ulong uVar3;
  __uint128_t *p_Var4;
  ulong uVar5;
  uint uVar6;
  
  uVar1 = CONCAT71(in_register_00000031,k);
  p_Var2 = (__uint128_t *)0x0;
  if (in_EDX == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    p_Var4 = __return_storage_ptr__;
    uVar5 = uVar1;
    do {
      uVar6 = (uint)p_Var4;
      p_Var4 = (__uint128_t *)((ulong)p_Var4 >> 2 | uVar5 << 0x3e);
      uVar3 = uVar3 << 2 | (ulong)p_Var2 >> 0x3e;
      uVar5 = uVar5 >> 2;
      p_Var2 = (__uint128_t *)((ulong)(uVar6 & 3) + (long)p_Var2 * 4 ^ 3);
      in_EDX = in_EDX + -1;
    } while (in_EDX != 0);
  }
  if (uVar3 < uVar1 || uVar3 - uVar1 < (ulong)(p_Var2 < __return_storage_ptr__)) {
    __return_storage_ptr__ = p_Var2;
  }
  return __return_storage_ptr__;
}

Assistant:

__uint128_t kmer_cannonical128(__uint128_t kmer, uint8_t k) {
    __uint128_t rkmer=kmer_reverse128(kmer,k);
    return (rkmer<kmer ? rkmer:kmer);
}